

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Log_Scope.h
# Opt level: O2

void __thiscall Nova::Log::Log_Scope::Dump_Names(Log_Scope *this,FILE *output)

{
  Log_Entry **ppLVar1;
  int i;
  ulong uVar2;
  
  Log_Entry::Dump_Names(&this->super_Log_Entry,output);
  for (uVar2 = 0;
      uVar2 < (ulong)((long)(this->children)._data.
                            super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>
                            ._M_impl.super__Vector_impl_data._M_finish -
                      (long)(this->children)._data.
                            super__Vector_base<Nova::Log::Log_Entry_*,_std::allocator<Nova::Log::Log_Entry_*>_>
                            ._M_impl.super__Vector_impl_data._M_start >> 3); uVar2 = uVar2 + 1) {
    ppLVar1 = Array<Nova::Log::Log_Entry_*>::operator()(&this->children,(int)uVar2);
    (*(*ppLVar1)->_vptr_Log_Entry[8])(*ppLVar1,output);
  }
  return;
}

Assistant:

void Dump_Names(FILE* output)
    {Log_Entry::Dump_Names(output);for(int i=0;i<children.size();++i)children(i)->Dump_Names(output);}